

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

void Cnf_AddCardinConstrPairWise(sat_solver *p,Vec_Int_t *vVars,int K,int fStrict)

{
  int iVar1;
  uint __line;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int nCapMin;
  char *__assertion;
  int iVar6;
  int Lit;
  int nVars;
  int local_34;
  
  local_34 = fStrict;
  iVar2 = sat_solver_nvars(p);
  iVar4 = vVars->nSize;
  nVars = iVar2;
  if (iVar4 < 2) {
    __assertion = "nSizeOld >= 2";
    __line = 0x73;
  }
  else {
    iVar6 = 0;
    do {
      if (vVars->nSize <= iVar6) {
        iVar6 = 1;
        do {
          iVar3 = iVar6;
          iVar6 = iVar3 * 2;
        } while (iVar3 < iVar4);
        sat_solver_setnvars(p,((uint)(iVar3 * iVar3) >> 1) + iVar2 + 1);
        if (iVar3 != iVar4) {
          iVar6 = vVars->nSize;
          if (iVar6 < iVar3) {
            iVar1 = vVars->nCap * 2;
            nCapMin = iVar3;
            if ((iVar1 < iVar3) || (nCapMin = iVar1, vVars->nCap < iVar3)) {
              Vec_IntGrow(vVars,nCapMin);
              iVar6 = vVars->nSize;
            }
            for (lVar5 = (long)iVar6; lVar5 < iVar3; lVar5 = lVar5 + 1) {
              vVars->pArray[lVar5] = iVar2;
            }
            vVars->nSize = iVar3;
          }
          nVars = iVar2 + 1;
          Lit = Abc_Var2Lit(iVar2,1);
          iVar2 = sat_solver_addclause(p,&Lit,&nVars);
          if (iVar2 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                          ,0x82,
                          "void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
          }
        }
        Cnf_AddCardinConstrRange(p,vVars->pArray,0,iVar3 + -1,&nVars);
        if ((0 < K) && (K < iVar4)) {
          iVar4 = Vec_IntEntry(vVars,K);
          Lit = Abc_Var2Lit(iVar4,1);
          iVar4 = sat_solver_addclause(p,&Lit,&nVars);
          if (iVar4 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                          ,0x8b,
                          "void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
          }
          if (local_34 != 0) {
            iVar4 = Vec_IntEntry(vVars,K + -1);
            Lit = Abc_Var2Lit(iVar4,0);
            iVar4 = sat_solver_addclause(p,&Lit,&nVars);
            if (iVar4 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                            ,0x90,
                            "void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)")
              ;
            }
          }
          Vec_IntShrink(vVars,0);
          return;
        }
        __assert_fail("K > 0 && K < nSizeOld",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                      ,0x88,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)")
        ;
      }
      iVar3 = Vec_IntEntry(vVars,iVar6);
    } while ((-1 < iVar3) && (iVar6 = iVar6 + 1, iVar3 < iVar2));
    __assertion = "iVar >= 0 && iVar < nVars";
    __line = 0x76;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                ,__line,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
}

Assistant:

void Cnf_AddCardinConstrPairWise( sat_solver * p, Vec_Int_t * vVars, int K, int fStrict )
{
    int nVars = sat_solver_nvars(p);
    int nSizeOld = Vec_IntSize(vVars);
    int i, iVar, nSize, Lit, nVarsOld;
    assert( nSizeOld >= 2 );
    // check that vars are ok
    Vec_IntForEachEntry( vVars, iVar, i )
        assert( iVar >= 0 && iVar < nVars );
    // make the size a degree of two
    for ( nSize = 1; nSize < nSizeOld; nSize *= 2 );
    // extend
    sat_solver_setnvars( p, nVars + 1 + nSize * nSize / 2 );
    if ( nSize != nSizeOld )
    {
        // fill in with const0
        Vec_IntFillExtra( vVars, nSize, nVars );
        // add const0 variable
        Lit = Abc_Var2Lit( nVars++, 1 );
        if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
            assert( 0 );
    }
    // construct recursively
    nVarsOld = nVars;
    Cnf_AddCardinConstrRange( p, Vec_IntArray(vVars), 0, nSize - 1, &nVars );
    // add final constraint
    assert( K > 0 && K < nSizeOld );
    Lit = Abc_Var2Lit( Vec_IntEntry(vVars, K), 1 );
    if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
        assert( 0 );
    if ( fStrict )
    {
        Lit = Abc_Var2Lit( Vec_IntEntry(vVars, K-1), 0 );
        if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
            assert( 0 );
    }
    // return to the old size
    Vec_IntShrink( vVars, 0 ); // make it unusable
    //printf( "The %d input sorting network contains %d sorters.\n", nSize, (nVars - nVarsOld)/2 );
}